

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O2

Output * __thiscall
ftxui::TerminalInputParser::Parse(Output *__return_storage_ptr__,TerminalInputParser *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = (long)this->position_ + 1;
  iVar2 = (int)lVar3;
  this->position_ = iVar2;
  if ((int)(this->pending_)._M_string_length <= iVar2) {
    __return_storage_ptr__->type = UNCOMPLETED;
    return __return_storage_ptr__;
  }
  bVar1 = (this->pending_)._M_dataplus._M_p[lVar3];
  if (bVar1 != 0x18) {
    if (bVar1 == 0x1b) {
      ParseESC(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (bVar1 != 0x1a) {
      if ((0x1f < bVar1) && (bVar1 != 0x7f)) {
        ParseUTF8(this);
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->type = SPECIAL;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->type = DROP;
  return __return_storage_ptr__;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::Parse() {
  if (!Eat())
    return UNCOMPLETED;

  switch (Current()) {
    case 24:  // CAN
    case 26:  // SUB
      return DROP;

    case '\x1B':
      return ParseESC();
    default:
      break;
  }

  if (Current() < 32)  // C0
    return SPECIAL;

  if (Current() == 127)  // Delete
    return SPECIAL;

  return ParseUTF8();
}